

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O3

void __thiscall Aircraft::Aircraft(Aircraft *this,string *aircraft_data_path)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  Aircraft *pAVar4;
  float value;
  string parameter;
  string line;
  ifstream file_stream;
  Mat MStack_5c8;
  float local_5b4;
  Mat *local_5b0;
  Mat *local_5a8;
  Mat *local_5a0;
  Mat *local_598;
  Aircraft *local_590;
  Aircraft *local_588;
  Aircraft *local_580;
  Aircraft *local_578;
  Aircraft *local_570;
  Aircraft *local_568;
  Aircraft *local_560;
  Aircraft *local_558;
  Aircraft *local_550;
  Aircraft *local_548;
  Aircraft *local_540;
  Aircraft *local_538;
  Aircraft *local_530;
  Aircraft *local_528;
  Aircraft *local_520;
  Aircraft *local_518;
  Aircraft *local_510;
  Aircraft *local_508;
  Aircraft *local_500;
  Aircraft *local_4f8;
  Aircraft *local_4f0;
  Aircraft *local_4e8;
  Aircraft *local_4e0;
  Aircraft *local_4d8;
  Aircraft *local_4d0;
  Aircraft *local_4c8;
  Aircraft *local_4c0;
  Aircraft *local_4b8;
  Aircraft *local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined1 local_498;
  undefined7 uStack_497;
  undefined1 *local_488;
  undefined8 local_480;
  undefined1 local_478;
  undefined7 uStack_477;
  double local_468;
  double local_460;
  double local_458;
  undefined8 local_450;
  double local_448;
  double local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  Mat local_428;
  Mat local_418;
  Mat local_408;
  Mat local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double local_3d0;
  undefined8 local_3c8;
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  double local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  double local_318;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  double local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  istream local_2c0 [520];
  double local_b8;
  double dStack_b0;
  undefined8 local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_598 = &this->A_long_;
  Mat::Mat(local_598);
  local_5a0 = &this->A_lat_;
  Mat::Mat(local_5a0);
  local_5a8 = &this->B_long_;
  Mat::Mat(local_5a8);
  local_5b0 = &this->B_lat_;
  Mat::Mat(local_5b0);
  local_488 = &local_478;
  local_480 = 0;
  local_478 = 0;
  local_4a8 = &local_498;
  local_4a0 = 0;
  local_498 = 0;
  std::ifstream::ifstream(local_2c0,(string *)aircraft_data_path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_590 = (Aircraft *)&this->W0_;
    local_588 = (Aircraft *)&this->U0_;
    local_580 = (Aircraft *)&this->alpha0_;
    local_578 = (Aircraft *)&this->theta0_;
    local_570 = (Aircraft *)&this->Ndr_;
    local_568 = (Aircraft *)&this->Ldr_;
    local_560 = (Aircraft *)&this->Ydr_;
    local_558 = (Aircraft *)&this->Nda_;
    local_550 = (Aircraft *)&this->Lda_;
    local_548 = (Aircraft *)&this->Mdt_;
    local_540 = (Aircraft *)&this->Xdt_;
    local_538 = (Aircraft *)&this->Mde_;
    local_530 = (Aircraft *)&this->Zde_;
    local_528 = (Aircraft *)&this->Xde_;
    local_520 = (Aircraft *)&this->Nr_;
    local_518 = (Aircraft *)&this->Np_;
    local_510 = (Aircraft *)&this->Nv_;
    local_508 = (Aircraft *)&this->Lr_;
    local_500 = (Aircraft *)&this->Lp_;
    local_4f8 = (Aircraft *)&this->Lv_;
    local_4f0 = (Aircraft *)&this->Yr_;
    local_4e8 = (Aircraft *)&this->Yp_;
    local_4e0 = (Aircraft *)&this->Yv_;
    local_4d8 = (Aircraft *)&this->Mq_;
    local_4d0 = (Aircraft *)&this->Mw_;
    local_4c8 = (Aircraft *)&this->Mu_;
    local_4c0 = (Aircraft *)&this->Zw_;
    local_4b8 = (Aircraft *)&this->Zu_;
    local_4b0 = (Aircraft *)&this->Xw_;
LAB_00107b6d:
    do {
      piVar3 = std::operator>>(local_2c0,(string *)&local_4a8);
      piVar3 = std::istream::_M_extract<float>((float *)piVar3);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
      pAVar4 = this;
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
        pAVar4 = (Aircraft *)&this->Xu_;
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
          pAVar4 = local_4b0;
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
            pAVar4 = local_4b8;
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
              pAVar4 = local_4c0;
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                pAVar4 = local_4c8;
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                  pAVar4 = local_4d0;
                  if (iVar2 != 0) {
                    iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                    pAVar4 = local_4d8;
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                      pAVar4 = local_4e0;
                      if (iVar2 != 0) {
                        iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                        pAVar4 = local_4e8;
                        if (iVar2 != 0) {
                          iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                          pAVar4 = local_4f0;
                          if (iVar2 != 0) {
                            iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                            pAVar4 = local_4f8;
                            if (iVar2 != 0) {
                              iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                              pAVar4 = local_500;
                              if (iVar2 != 0) {
                                iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                                pAVar4 = local_508;
                                if (iVar2 != 0) {
                                  iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                                  pAVar4 = local_510;
                                  if (iVar2 != 0) {
                                    iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                                    pAVar4 = local_518;
                                    if (iVar2 != 0) {
                                      iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                                      pAVar4 = local_520;
                                      if (iVar2 != 0) {
                                        iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                                        pAVar4 = local_528;
                                        if (iVar2 != 0) {
                                          iVar2 = std::__cxx11::string::compare((char *)&local_4a8);
                                          pAVar4 = local_530;
                                          if (iVar2 != 0) {
                                            iVar2 = std::__cxx11::string::compare
                                                              ((char *)&local_4a8);
                                            pAVar4 = local_538;
                                            if (iVar2 != 0) {
                                              iVar2 = std::__cxx11::string::compare
                                                                ((char *)&local_4a8);
                                              pAVar4 = local_540;
                                              if (iVar2 != 0) {
                                                iVar2 = std::__cxx11::string::compare
                                                                  ((char *)&local_4a8);
                                                pAVar4 = local_548;
                                                if (iVar2 != 0) {
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)&local_4a8);
                                                  pAVar4 = local_550;
                                                  if (iVar2 != 0) {
                                                    iVar2 = std::__cxx11::string::compare
                                                                      ((char *)&local_4a8);
                                                    pAVar4 = local_558;
                                                    if (iVar2 != 0) {
                                                      iVar2 = std::__cxx11::string::compare
                                                                        ((char *)&local_4a8);
                                                      pAVar4 = local_560;
                                                      if (iVar2 != 0) {
                                                        iVar2 = std::__cxx11::string::compare
                                                                          ((char *)&local_4a8);
                                                        pAVar4 = local_568;
                                                        if (iVar2 != 0) {
                                                          iVar2 = std::__cxx11::string::compare
                                                                            ((char *)&local_4a8);
                                                          pAVar4 = local_570;
                                                          if (iVar2 != 0) {
                                                            iVar2 = std::__cxx11::string::compare
                                                                              ((char *)&local_4a8);
                                                            pAVar4 = local_578;
                                                            if (iVar2 != 0) {
                                                              iVar2 = std::__cxx11::string::compare
                                                                                ((char *)&local_4a8)
                                                              ;
                                                              pAVar4 = local_580;
                                                              if (iVar2 != 0) {
                                                                iVar2 = std::__cxx11::string::
                                                                        compare((char *)&local_4a8);
                                                                pAVar4 = local_588;
                                                                if (iVar2 != 0) {
                                                                  iVar2 = std::__cxx11::string::
                                                                          compare((char *)&local_4a8
                                                                                 );
                                                                  pAVar4 = local_590;
                                                                  if (iVar2 != 0) {
                                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "Parsing Error: No matching parameter",
                                                             0x24);
                                                  std::endl<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout);
                                                  goto LAB_00107b6d;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pAVar4->mass_ = (double)local_5b4;
    } while( true );
  }
  local_b8 = this->Xu_;
  dStack_b0 = this->Xw_;
  local_a8 = 0;
  local_a0 = cos(this->theta0_);
  local_a0 = local_a0 * -9.81;
  local_98 = this->Zu_;
  dStack_90 = this->Zw_;
  local_88 = this->U0_;
  local_80 = sin(this->theta0_);
  local_80 = local_80 * -9.81;
  local_78 = this->Mu_;
  dStack_70 = this->Mw_;
  local_68 = this->Mq_;
  local_50 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0;
  local_468 = this->Xde_;
  local_460 = this->Xdt_;
  local_458 = this->Zde_;
  local_450 = 0;
  local_448 = this->Mde_;
  local_440 = this->Mdt_;
  local_438 = 0;
  uStack_430 = 0;
  local_3e8 = this->Yv_;
  dStack_3e0 = this->Yp_;
  local_3d8 = -(this->U0_ - this->Yr_);
  local_3d0 = cos(this->theta0_);
  local_3d0 = local_3d0 * 9.81;
  local_3c8 = 0;
  local_3c0 = this->Lv_;
  dStack_3b8 = this->Lp_;
  local_3b0 = this->Lr_;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_398 = this->Nv_;
  dStack_390 = this->Np_;
  local_388 = this->Nr_;
  local_370 = 0;
  local_380 = 0;
  uStack_378 = 0;
  local_368 = 0x3ff0000000000000;
  local_340 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_338 = cos(this->theta0_);
  local_338 = 1.0 / local_338;
  local_330 = 0;
  uStack_328 = 0;
  local_318 = 0.0;
  uStack_308 = *(undefined4 *)&this->Lda_;
  uStack_304 = *(undefined4 *)((long)&this->Lda_ + 4);
  uStack_2f8 = *(undefined4 *)&this->Nda_;
  uStack_2f4 = *(undefined4 *)((long)&this->Nda_ + 4);
  local_310 = *(undefined4 *)&this->Ydr_;
  uStack_30c = *(undefined4 *)((long)&this->Ydr_ + 4);
  local_300 = *(undefined4 *)&this->Ldr_;
  uStack_2fc = *(undefined4 *)((long)&this->Ldr_ + 4);
  local_2f0 = this->Ndr_;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  Mat::Mat(&MStack_5c8,4,4,&local_b8);
  Mat::operator=(&local_3f8,local_598);
  Mat::~Mat(&local_3f8);
  Mat::~Mat(&MStack_5c8);
  Mat::Mat(&MStack_5c8,4,2,&local_468);
  Mat::operator=(&local_408,local_5a8);
  Mat::~Mat(&local_408);
  Mat::~Mat(&MStack_5c8);
  Mat::Mat(&MStack_5c8,5,5,&local_3e8);
  Mat::operator=(&local_418,local_5a0);
  Mat::~Mat(&local_418);
  Mat::~Mat(&MStack_5c8);
  Mat::Mat(&MStack_5c8,5,2,&local_318);
  Mat::operator=(&local_428,local_5b0);
  Mat::~Mat(&local_428);
  Mat::~Mat(&MStack_5c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Aicraft object has been constructed.",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::ifstream::~ifstream(local_2c0);
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,CONCAT71(uStack_497,local_498) + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,CONCAT71(uStack_477,local_478) + 1);
  }
  return;
}

Assistant:

Aircraft::Aircraft(const std::string &aircraft_data_path) {
    // Load the aircraft parameters from the text file
    std::string line;
    std::string parameter;
    float value;
    std::ifstream file_stream(aircraft_data_path);
    if (file_stream.is_open()) 
    {
        while (file_stream >> parameter >> value)
        {
            if (parameter.compare("mass") == 0) {
                mass_ = value;
            } else if (parameter.compare("Xu") == 0) {
                Xu_ = value;
            } else if (parameter.compare("Xw") == 0) {
                Xw_ = value;
            } else if (parameter.compare("Zu") == 0) {
                Zu_ = value;
            } else if (parameter.compare("Zw") == 0) {
                Zw_ = value;
            } else if (parameter.compare("Mu") == 0) {
                Mu_ = value;
            } else if (parameter.compare("Mw") == 0) {
                Mw_ = value;
            } else if (parameter.compare("Mq") == 0) {
                Mq_ = value;
            } else if (parameter.compare("Yv") == 0) {
                Yv_ = value;
            } else if (parameter.compare("Yp") == 0) {
                Yp_ = value;
            } else if (parameter.compare("Yr") == 0) {
                Yr_ = value;
            } else if (parameter.compare("Lv") == 0) {
                Lv_ = value;
            } else if (parameter.compare("Lp") == 0) {
                Lp_ = value;
            } else if (parameter.compare("Lr") == 0) {
                Lr_ = value;
            } else if (parameter.compare("Nv") == 0) {
                Nv_ = value;
            } else if (parameter.compare("Np") == 0) {
                Np_ = value;
            } else if (parameter.compare("Nr") == 0) {
                Nr_ = value;
            } else if (parameter.compare("Xde") == 0) {
                Xde_ = value;
            } else if (parameter.compare("Zde") == 0) {
                Zde_ = value;
            } else if (parameter.compare("Mde") == 0) {
                Mde_ = value;
            } else if (parameter.compare("Xdt") == 0) {
                Xdt_ = value;
            } else if (parameter.compare("Mdt") == 0) {
                Mdt_ = value;
            } else if (parameter.compare("Lda") == 0) {
                Lda_ = value;
            } else if (parameter.compare("Nda") == 0) {
                Nda_ = value;
            } else if (parameter.compare("Ydr") == 0) {
                Ydr_ = value;
            } else if (parameter.compare("Ldr") == 0) {
                Ldr_ = value;
            } else if (parameter.compare("Ndr") == 0) {
                Ndr_ = value;
            } else if (parameter.compare("theta0") == 0) {
                theta0_ = value;
            } else if (parameter.compare("alpha0") == 0) {
                alpha0_ = value;
            } else if (parameter.compare("U0") == 0) {
                U0_ = value;
            } else if (parameter.compare("W0") == 0) {
                W0_ = value;
            } else {
                std::cout << "Parsing Error: No matching parameter" << std::endl;
            }      
        }
    }
    
    // Initialize system matrices
    double A_long_param_list[16] = {Xu_, Xw_, 0, -1 * GRAVITY * cos(theta0_),
                                    Zu_, Zw_, U0_, -1* GRAVITY * sin(theta0_),
                                    Mu_, Mw_, Mq_, 0,
                                    0, 0, 1, 0};
    double B_long_param_list[8] = {Xde_, Xdt_,
                                   Zde_, 0,
                                   Mde_, Mdt_,
                                   0, 0};
    double A_lat_param_list[25] = {Yv_, Yp_, -1 * (U0_ - Yr_), GRAVITY * cos(theta0_), 0,
                                   Lv_, Lp_, Lr_, 0, 0,
                                   Nv_, Np_, Nr_, 0, 0,
                                   0, 1, 0, 0, 0,
                                   0, 0, 1 / cos(theta0_), 0, 0};
    double B_lat_param_list[10] = {0, Ydr_,
                                   Lda_, Ldr_,
                                   Nda_, Ndr_,
                                   0, 0,
                                   0, 0};

    A_long_ = Mat(4, 4, A_long_param_list);
    B_long_ = Mat(4, 2, B_long_param_list);
    A_lat_ = Mat(5, 5, A_lat_param_list);
    B_lat_ = Mat(5, 2, B_lat_param_list);

    std::cout << "Aicraft object has been constructed." << std::endl;
}